

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaC_step(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  global_State *pgVar3;
  global_State *g_00;
  global_State *pgVar4;
  ulong osize;
  TValue *pTVar5;
  Node *pNVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  GCObject **ppGVar11;
  char *pcVar12;
  size_t sVar13;
  l_mem lVar14;
  lu_mem lVar15;
  long lVar16;
  GCObject *pGVar17;
  long lVar18;
  global_State *g;
  Table *h;
  UpVal *pUVar19;
  ulong uVar20;
  
  pgVar3 = L->l_G;
  uVar2 = pgVar3->gcstepmul * 10;
  uVar20 = 0x7ffffffffffffffe;
  if (uVar2 != 0) {
    uVar20 = (ulong)uVar2;
  }
  pgVar3->gcdept = pgVar3->gcdept + (pgVar3->totalbytes - pgVar3->GCthreshold);
  do {
    g_00 = L->l_G;
    switch(g_00->gcstate) {
    case '\0':
      g_00->gray = (GCObject *)0x0;
      g_00->grayagain = (GCObject *)0x0;
      g_00->weak = (GCObject *)0x0;
      if (((((GCObject *)g_00->mainthread)->gch).marked & 3) != 0) {
        reallymarkobject(g_00,(GCObject *)g_00->mainthread);
      }
      if ((3 < (g_00->mainthread->l_gt).tt) &&
         (pGVar17 = (g_00->mainthread->l_gt).value.gc, ((pGVar17->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar17);
      }
      if ((3 < (L->l_G->l_registry).tt) &&
         (pGVar17 = (L->l_G->l_registry).value.gc, ((pGVar17->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar17);
      }
      markmt(g_00);
      g_00->gcstate = '\x01';
    default:
switchD_0010695f_default:
      lVar10 = 0;
      break;
    case '\x01':
      if (g_00->gray == (GCObject *)0x0) {
        for (pUVar19 = (g_00->uvhead).u.l.next; pUVar19 != &g_00->uvhead;
            pUVar19 = (pUVar19->u).l.next) {
          if ((((pUVar19->marked & 7) == 0) && (3 < pUVar19->v->tt)) &&
             (pGVar17 = (pUVar19->v->value).gc, ((pGVar17->gch).marked & 3) != 0)) {
            reallymarkobject(g_00,pGVar17);
          }
        }
        while (g_00->gray != (GCObject *)0x0) {
          propagatemark(g_00);
        }
        g_00->gray = g_00->weak;
        g_00->weak = (GCObject *)0x0;
        if ((L->marked & 3) != 0) {
          reallymarkobject(g_00,(GCObject *)L);
        }
        markmt(g_00);
        while (g_00->gray != (GCObject *)0x0) {
          propagatemark(g_00);
        }
        pGVar17 = g_00->grayagain;
        g_00->gray = pGVar17;
        g_00->grayagain = (GCObject *)0x0;
        while (pGVar17 != (GCObject *)0x0) {
          propagatemark(g_00);
          pGVar17 = g_00->gray;
        }
        sVar13 = luaC_separateudata(L,0);
        pGVar17 = g_00->tmudata;
        if (pGVar17 != (GCObject *)0x0) {
          do {
            pGVar17 = (pGVar17->gch).next;
            (pGVar17->gch).marked = g_00->currentwhite & 3 | (pGVar17->gch).marked & 0xf8;
            reallymarkobject(g_00,pGVar17);
          } while (pGVar17 != g_00->tmudata);
        }
        if (g_00->gray == (GCObject *)0x0) {
          lVar10 = 0;
        }
        else {
          lVar10 = 0;
          do {
            lVar14 = propagatemark(g_00);
            lVar10 = lVar10 + lVar14;
          } while (g_00->gray != (GCObject *)0x0);
        }
        for (pGVar17 = g_00->weak; pGVar17 != (GCObject *)0x0; pGVar17 = (pGVar17->h).gclist) {
          if ((((pGVar17->gch).marked & 0x10) != 0) &&
             (lVar16 = (long)(pGVar17->h).sizearray, lVar16 != 0)) {
            lVar18 = lVar16 << 4;
            do {
              pTVar5 = (pGVar17->h).array;
              iVar9 = iscleared((TValue *)((long)&pTVar5[-1].value + lVar18),0);
              if (iVar9 != 0) {
                *(undefined4 *)((long)&pTVar5[-1].tt + lVar18) = 0;
              }
              lVar16 = lVar16 + -1;
              lVar18 = lVar18 + -0x10;
            } while (lVar16 != 0);
          }
          if ((pGVar17->h).lsizenode < 0x20) {
            lVar18 = (0x100000000 << ((pGVar17->h).lsizenode & 0x3f)) >> 0x20;
            lVar16 = lVar18 * 0x28;
            do {
              pNVar6 = (pGVar17->h).node;
              if (*(int *)((long)&pNVar6[-1].i_val.tt + lVar16) != 0) {
                iVar9 = *(int *)((long)&pNVar6[-1].i_key + lVar16 + 8);
                if (iVar9 < 4) {
LAB_00106cd7:
                  iVar9 = iscleared((TValue *)((long)&pNVar6[-1].i_val.value + lVar16),0);
                  if (iVar9 == 0) goto LAB_00106cfd;
                }
                else {
                  lVar7 = *(long *)((long)&pNVar6[-1].i_key + lVar16);
                  bVar1 = *(byte *)(lVar7 + 9);
                  if (iVar9 == 4) {
                    *(byte *)(lVar7 + 9) = bVar1 & 0xfc;
                    goto LAB_00106cd7;
                  }
                  if ((bVar1 & 3) == 0) goto LAB_00106cd7;
                }
                *(undefined4 *)((long)&pNVar6[-1].i_val.tt + lVar16) = 0;
                if (3 < *(int *)((long)&pNVar6[-1].i_key + lVar16 + 8)) {
                  *(undefined4 *)((long)&pNVar6[-1].i_key + lVar16 + 8) = 0xb;
                }
              }
LAB_00106cfd:
              lVar18 = lVar18 + -1;
              lVar16 = lVar16 + -0x28;
            } while (lVar18 != 0);
          }
        }
        g_00->currentwhite = g_00->currentwhite ^ 3;
        g_00->sweepstrgc = 0;
        g_00->sweepgc = &g_00->rootgc;
        g_00->gcstate = '\x02';
        g_00->estimate = g_00->totalbytes - (lVar10 + sVar13);
        lVar10 = 0;
      }
      else {
        lVar10 = propagatemark(g_00);
      }
      break;
    case '\x02':
      lVar15 = g_00->totalbytes;
      iVar9 = g_00->sweepstrgc;
      g_00->sweepstrgc = iVar9 + 1;
      sweeplist(L,(g_00->strt).hash + iVar9,0xfffffffffffffffd);
      if ((g_00->strt).size <= g_00->sweepstrgc) {
        g_00->gcstate = '\x03';
      }
      g_00->estimate = g_00->estimate + (g_00->totalbytes - lVar15);
      lVar10 = 10;
      break;
    case '\x03':
      lVar15 = g_00->totalbytes;
      ppGVar11 = sweeplist(L,g_00->sweepgc,0x28);
      g_00->sweepgc = ppGVar11;
      if (*ppGVar11 == (GCObject *)0x0) {
        pgVar4 = L->l_G;
        uVar2 = (pgVar4->strt).size;
        uVar8 = uVar2 + 3;
        if (-1 < (int)uVar2) {
          uVar8 = uVar2;
        }
        if ((0x40 < (int)uVar2) && ((pgVar4->strt).nuse < (uint)((int)uVar8 >> 2))) {
          luaS_resize(L,uVar2 >> 1);
        }
        osize = (pgVar4->buff).buffsize;
        if (0x40 < osize) {
          pcVar12 = (char *)luaM_realloc_(L,(pgVar4->buff).buffer,osize,osize >> 1);
          (pgVar4->buff).buffer = pcVar12;
          (pgVar4->buff).buffsize = osize >> 1;
        }
        g_00->gcstate = '\x04';
      }
      g_00->estimate = g_00->estimate + (g_00->totalbytes - lVar15);
      lVar10 = 400;
      break;
    case '\x04':
      if (g_00->tmudata == (GCObject *)0x0) {
        g_00->gcstate = '\0';
        g_00->gcdept = 0;
        goto switchD_0010695f_default;
      }
      GCTM(L);
      lVar10 = 100;
      if (100 < g_00->estimate) {
        g_00->estimate = g_00->estimate - 100;
      }
    }
    if ((pgVar3->gcstate == '\0') || (uVar20 = uVar20 - lVar10, (long)uVar20 < 1)) {
      if (pgVar3->gcstate == '\0') {
        lVar15 = (long)pgVar3->gcpause * (pgVar3->estimate / 100);
      }
      else if (pgVar3->gcdept < 0x400) {
        lVar15 = pgVar3->totalbytes + 0x400;
      }
      else {
        pgVar3->gcdept = pgVar3->gcdept - 0x400;
        lVar15 = pgVar3->totalbytes;
      }
      pgVar3->GCthreshold = lVar15;
      return;
    }
  } while( true );
}

Assistant:

static void luaC_step(lua_State*L){
global_State*g=G(L);
l_mem lim=(1024u/100)*g->gcstepmul;
if(lim==0)
lim=(((lu_mem)(~(lu_mem)0)-2)-1)/2;
g->gcdept+=g->totalbytes-g->GCthreshold;
do{
lim-=singlestep(L);
if(g->gcstate==0)
break;
}while(lim>0);
if(g->gcstate!=0){
if(g->gcdept<1024u)
g->GCthreshold=g->totalbytes+1024u;
else{
g->gcdept-=1024u;
g->GCthreshold=g->totalbytes;
}
}
else{
setthreshold(g);
}
}